

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tape.cpp
# Opt level: O0

void writeheader(uchar flag,char *fname,unsigned_short param1,unsigned_short param2,
                unsigned_short param3,FILE *fp)

{
  int local_34;
  uchar *puStack_30;
  int i;
  char *ptr;
  FILE *fp_local;
  unsigned_short param3_local;
  unsigned_short param2_local;
  unsigned_short param1_local;
  char *fname_local;
  uchar flag_local;
  
  writeword(0x13,fp);
  writebyte('\0',fp);
  parity = '\0';
  writebyte(flag,fp);
  puStack_30 = (uchar *)fname;
  for (local_34 = 0; local_34 < 10; local_34 = local_34 + 1) {
    if (*puStack_30 == '\0') {
      writebyte(' ',fp);
    }
    else {
      writebyte(*puStack_30,fp);
      puStack_30 = puStack_30 + 1;
    }
  }
  writeword((uint)param1,fp);
  writeword((uint)param2,fp);
  writeword((uint)param3,fp);
  writebyte(parity,fp);
  return;
}

Assistant:

static void writeheader(unsigned char flag, const char *fname, unsigned short param1, unsigned short param2, unsigned short param3, FILE *fp) {
	/* Write out the code header file */
	writeword(19, fp);		/* Header len */
	writebyte(0, fp);		/* Header is 0 */
	parity = 0;
	writebyte(flag, fp);	/* Filetype flag */

	const char *ptr = fname;
	for (int i = 0; i < 10; i++) {
		if (*ptr) {
			writebyte(*ptr++, fp);
		} else {
			writebyte(' ', fp);
		}
	}

	writeword(param1, fp);
	writeword(param2, fp);
	writeword(param3, fp);
	writebyte(parity, fp);
}